

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

long __thiscall mkvparser::Segment::Load(Segment *this)

{
  longlong lVar1;
  long lVar2;
  longlong lVar3;
  longlong pos;
  long local_30;
  longlong local_28;
  
  lVar3 = -1;
  if (((this->m_clusters == (Cluster **)0x0) && (this->m_clusterSize == 0)) &&
     (this->m_clusterCount == 0)) {
    lVar1 = ParseHeaders(this);
    lVar3 = lVar1;
    if (((-1 < lVar1) && (lVar3 = -3, lVar1 == 0)) &&
       ((lVar3 = -2, this->m_pInfo != (SegmentInfo *)0x0 && (this->m_pTracks != (Tracks *)0x0)))) {
      do {
        do {
          lVar2 = DoLoadCluster(this,&local_28,&local_30);
        } while (1 < lVar2);
        lVar3 = lVar2;
      } while (((-1 < lVar2) && (lVar3 = 0, lVar2 == 0)) && (this->m_type != kTypeLiveStream));
    }
  }
  return lVar3;
}

Assistant:

long Segment::Load() {
  if (m_clusters != NULL || m_clusterSize != 0 || m_clusterCount != 0)
    return E_PARSE_FAILED;

  // Outermost (level 0) segment object has been constructed,
  // and pos designates start of payload.  We need to find the
  // inner (level 1) elements.

  const long long header_status = ParseHeaders();

  if (header_status < 0)  // error
    return static_cast<long>(header_status);

  if (header_status > 0)  // underflow
    return E_BUFFER_NOT_FULL;

  if (m_pInfo == NULL || m_pTracks == NULL)
    return E_FILE_FORMAT_INVALID;

  for (;;) {
    const long status = LoadCluster();

    if (status < 0)  // error
      return status;

    if (status >= 1)  // no more clusters
      return 0;

    if (m_type == kTypeLiveStream)
      return 0; // Live streams only have one cluster loaded at any point in time.
  }
}